

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

void __thiscall chaiscript::eval::Noop_AST_Node::Noop_AST_Node(Noop_AST_Node *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  char *__end;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  local_38;
  
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0030cf08;
  p_Var3 = p_Var2 + 2;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)p_Var3;
  if (local_78 == &local_68) {
    p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_67,local_68);
    p_Var2[2]._M_use_count = (undefined4)uStack_60;
    p_Var2[2]._M_weak_count = uStack_60._4_4_;
  }
  else {
    (((element_type *)(p_Var2 + 1))->_M_dataplus)._M_p = local_78;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_67,local_68);
  }
  p_Var2[1]._M_use_count = (undefined4)local_70;
  p_Var2[1]._M_weak_count = local_70._4_4_;
  local_70 = 0;
  local_68 = '\0';
  (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)&PTR_pretty_print_abi_cxx11__0030d000;
  (this->super_AST_Node).identifier = 0x38;
  paVar1 = &(this->super_AST_Node).text.field_2;
  (this->super_AST_Node).text._M_dataplus._M_p = (pointer)paVar1;
  if (local_58 == &local_48) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&(this->super_AST_Node).text.field_2 + 8) = uStack_40;
  }
  else {
    (this->super_AST_Node).text._M_dataplus._M_p = local_58;
    (this->super_AST_Node).text.field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  (this->super_AST_Node).text._M_string_length = local_50;
  local_50 = 0;
  local_48 = '\0';
  (this->super_AST_Node).location.start.line = 0;
  (this->super_AST_Node).location.start.column = 0;
  (this->super_AST_Node).location.end.line = 0;
  (this->super_AST_Node).location.end.column = 0;
  (this->super_AST_Node).location.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var2 + 1);
  (this->super_AST_Node).location.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  (this->super_AST_Node).children.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_AST_Node).children.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_AST_Node).children.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_AST_Node).annotation.
  super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_AST_Node).annotation.
  super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = &local_68;
  local_58 = &local_48;
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(&local_38);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)&PTR_pretty_print_abi_cxx11__00310650;
  const_var((chaiscript *)&this->m_value,true);
  return;
}

Assistant:

Noop_AST_Node() :
          AST_Node("", AST_Node_Type::Noop, Parse_Location()),
          m_value(const_var(true))
        { }